

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall
DependencyScan::RecomputeDirty
          (DependencyScan *this,Node *node,vector<Node_*,_std::allocator<Node_*>_> *stack,
          string *err)

{
  Edge *edge;
  Edge *pEVar1;
  pointer ppNVar2;
  bool bVar3;
  undefined7 extraout_var;
  Node *pNVar4;
  pointer ppNVar5;
  Node *pNVar6;
  uint uVar7;
  string *in_R8;
  pointer ppNVar8;
  bool local_45;
  uint local_44;
  vector<Node_*,_std::allocator<Node_*>_> *local_40;
  Node *local_38;
  
  edge = node->in_edge_;
  local_38 = node;
  if (edge == (Edge *)0x0) {
    if (node->mtime_ != -1) {
      return true;
    }
    bVar3 = Node::StatIfNecessary(node,this->disk_interface_,err);
    if (bVar3) {
      if (node->mtime_ == 0) {
        bVar3 = true;
        if (g_explaining == true) {
          fprintf(_stderr,"ninja explain: %s has no in-edge and is missing\n",
                  (node->path_)._M_dataplus._M_p);
          bVar3 = node->mtime_ == 0;
        }
      }
      else {
        bVar3 = false;
      }
      node->dirty_ = bVar3;
      return true;
    }
  }
  else {
    if (edge->mark_ == VisitDone) {
      return true;
    }
    bVar3 = VerifyDAG(this,node,stack,err);
    if (bVar3) {
      edge->mark_ = VisitInStack;
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(stack,&local_38);
      edge->outputs_ready_ = true;
      edge->deps_missing_ = false;
      if (((edge->deps_loaded_ == false) && (pNVar6 = edge->dyndep_, pNVar6 != (Node *)0x0)) &&
         (pNVar6->dyndep_pending_ == true)) {
        bVar3 = RecomputeDirty(this,pNVar6,stack,err);
        if (!bVar3) {
          return false;
        }
        pEVar1 = edge->dyndep_->in_edge_;
        if (((pEVar1 == (Edge *)0x0) || (pEVar1->outputs_ready_ == true)) &&
           (bVar3 = DyndepLoader::LoadDyndeps(&this->dyndep_loader_,edge->dyndep_,err), !bVar3)) {
          return false;
        }
      }
      ppNVar5 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_40 = stack;
      do {
        if (ppNVar5 ==
            (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (edge->deps_loaded_ == false) {
            edge->deps_loaded_ = true;
            bVar3 = ImplicitDepLoader::LoadDeps(&this->dep_loader_,edge,err);
            if (bVar3) goto LAB_00114773;
            if (err->_M_string_length != 0) {
              return false;
            }
            edge->deps_missing_ = true;
            local_44 = (uint)CONCAT71(extraout_var,1);
          }
          else {
LAB_00114773:
            local_44 = 0;
          }
          ppNVar5 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pNVar6 = (Node *)0x0;
          ppNVar8 = ppNVar5;
          goto LAB_00114784;
        }
        bVar3 = Node::StatIfNecessary(*ppNVar5,this->disk_interface_,err);
        ppNVar5 = ppNVar5 + 1;
      } while (bVar3);
    }
  }
  return false;
LAB_00114784:
  if (ppNVar8 ==
      (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_45 = SUB41(local_44,0);
    uVar7 = local_44;
    if ((local_44 & 1) == 0) {
      RecomputeOutputsDirty(this,edge,pNVar6,&local_45,in_R8);
      uVar7 = (uint)local_45;
    }
    ppNVar8 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar5 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppNVar5 != ppNVar8; ppNVar5 = ppNVar5 + 1) {
      if ((uVar7 & 1) != 0) {
        (*ppNVar5)->dirty_ = true;
      }
    }
    if (((uVar7 & 1) != 0) &&
       ((edge->rule_ != &State::kPhonyRule ||
        ((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish)))) {
      edge->outputs_ready_ = false;
    }
    edge->mark_ = VisitDone;
    ppNVar5 = (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar5[-1] != local_38) {
      __assert_fail("stack->back() == node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph.cc"
                    ,0xaa,"bool DependencyScan::RecomputeDirty(Node *, vector<Node *> *, string *)")
      ;
    }
    (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
    _M_finish = ppNVar5 + -1;
    return true;
  }
  bVar3 = RecomputeDirty(this,*ppNVar8,local_40,err);
  if (!bVar3) {
    return false;
  }
  pNVar4 = *ppNVar8;
  if ((pNVar4->in_edge_ != (Edge *)0x0) && (pNVar4->in_edge_->outputs_ready_ == false)) {
    edge->outputs_ready_ = false;
  }
  ppNVar2 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)ppNVar5 - (long)ppNVar2 >> 3) <
      (ulong)(((long)(edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3) -
             (long)edge->order_only_deps_)) {
    if (pNVar4->dirty_ == true) {
      local_44 = (uint)CONCAT71((int7)(int3)((uint)edge->order_only_deps_ >> 8),1);
      if (g_explaining == true) {
        fprintf(_stderr,"ninja explain: %s is dirty\n",(pNVar4->path_)._M_dataplus._M_p);
      }
      goto LAB_0011482b;
    }
    if ((pNVar6 != (Node *)0x0) && (pNVar4->mtime_ <= pNVar6->mtime_)) goto LAB_0011482b;
  }
  else {
LAB_0011482b:
    pNVar4 = pNVar6;
  }
  ppNVar8 = ppNVar8 + 1;
  ppNVar5 = ppNVar5 + 1;
  pNVar6 = pNVar4;
  goto LAB_00114784;
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* node, vector<Node*>* stack,
                                    string* err) {
  Edge* edge = node->in_edge();
  if (!edge) {
    // If we already visited this leaf node then we are done.
    if (node->status_known())
      return true;
    // This node has no in-edge; it is dirty if it is missing.
    if (!node->StatIfNecessary(disk_interface_, err))
      return false;
    if (!node->exists())
      EXPLAIN("%s has no in-edge and is missing", node->path().c_str());
    node->set_dirty(!node->exists());
    return true;
  }

  // If we already finished this edge then we are done.
  if (edge->mark_ == Edge::VisitDone)
    return true;

  // If we encountered this edge earlier in the call stack we have a cycle.
  if (!VerifyDAG(node, stack, err))
    return false;

  // Mark the edge temporarily while in the call stack.
  edge->mark_ = Edge::VisitInStack;
  stack->push_back(node);

  bool dirty = false;
  edge->outputs_ready_ = true;
  edge->deps_missing_ = false;

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.
    // If there is a pending dyndep file, visit it now:
    // * If the dyndep file is ready then load it now to get any
    //   additional inputs and outputs for this and other edges.
    //   Once the dyndep file is loaded it will no longer be pending
    //   if any other edges encounter it, but they will already have
    //   been updated.
    // * If the dyndep file is not ready then since is known to be an
    //   input to this edge, the edge will not be considered ready below.
    //   Later during the build the dyndep file will become ready and be
    //   loaded to update this edge before it can possibly be scheduled.
    if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
      if (!RecomputeDirty(edge->dyndep_, stack, err))
        return false;

      if (!edge->dyndep_->in_edge() ||
          edge->dyndep_->in_edge()->outputs_ready()) {
        // The dyndep file is ready, so load it now.
        if (!LoadDyndeps(edge->dyndep_, err))
          return false;
      }
    }
  }

  // Load output mtimes so we can compare them to the most recent input below.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!(*o)->StatIfNecessary(disk_interface_, err))
      return false;
  }

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.  Load discovered deps.
    edge->deps_loaded_ = true;
    if (!dep_loader_.LoadDeps(edge, err)) {
      if (!err->empty())
        return false;
      // Failed to load dependency info: rebuild to regenerate it.
      // LoadDeps() did EXPLAIN() already, no need to do it here.
      dirty = edge->deps_missing_ = true;
    }
  }

  // Visit all inputs; we're dirty if any of the inputs are dirty.
  Node* most_recent_input = NULL;
  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    // Visit this input.
    if (!RecomputeDirty(*i, stack, err))
      return false;

    // If an input is not ready, neither are our outputs.
    if (Edge* in_edge = (*i)->in_edge()) {
      if (!in_edge->outputs_ready_)
        edge->outputs_ready_ = false;
    }

    if (!edge->is_order_only(i - edge->inputs_.begin())) {
      // If a regular input is dirty (or missing), we're dirty.
      // Otherwise consider mtime.
      if ((*i)->dirty()) {
        EXPLAIN("%s is dirty", (*i)->path().c_str());
        dirty = true;
      } else {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime()) {
          most_recent_input = *i;
        }
      }
    }
  }

  // We may also be dirty due to output state: missing outputs, out of
  // date outputs, etc.  Visit all outputs and determine whether they're dirty.
  if (!dirty)
    if (!RecomputeOutputsDirty(edge, most_recent_input, &dirty, err))
      return false;

  // Finally, visit each output and update their dirty state if necessary.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (dirty)
      (*o)->MarkDirty();
  }

  // If an edge is dirty, its outputs are normally not ready.  (It's
  // possible to be clean but still not be ready in the presence of
  // order-only inputs.)
  // But phony edges with no inputs have nothing to do, so are always
  // ready.
  if (dirty && !(edge->is_phony() && edge->inputs_.empty()))
    edge->outputs_ready_ = false;

  // Mark the edge as finished during this walk now that it will no longer
  // be in the call stack.
  edge->mark_ = Edge::VisitDone;
  assert(stack->back() == node);
  stack->pop_back();

  return true;
}